

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall
wabt::WastParser::ParseTextListOpt
          (WastParser *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  bool bVar1;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> out;
  Token local_80;
  string_view local_40;
  undefined1 local_30 [8];
  TextVector texts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_local;
  WastParser *this_local;
  
  texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)out_data;
  std::vector<wabt::string_view,_std::allocator<wabt::string_view>_>::vector
            ((vector<wabt::string_view,_std::allocator<wabt::string_view>_> *)local_30);
  while( true ) {
    bVar1 = PeekMatch(this,Text);
    if (!bVar1) break;
    Consume(&local_80,this);
    local_40 = Token::text(&local_80);
    std::vector<wabt::string_view,_std::allocator<wabt::string_view>_>::push_back
              ((vector<wabt::string_view,_std::allocator<wabt::string_view>_> *)local_30,&local_40);
  }
  out = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  (anonymous_namespace)::
  RemoveEscapes<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((TextVector *)local_30,out);
  bVar1 = std::vector<wabt::string_view,_std::allocator<wabt::string_view>_>::empty
                    ((vector<wabt::string_view,_std::allocator<wabt::string_view>_> *)local_30);
  std::vector<wabt::string_view,_std::allocator<wabt::string_view>_>::~vector
            ((vector<wabt::string_view,_std::allocator<wabt::string_view>_> *)local_30);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool WastParser::ParseTextListOpt(std::vector<uint8_t>* out_data) {
  WABT_TRACE(ParseTextListOpt);
  TextVector texts;
  while (PeekMatch(TokenType::Text))
    texts.push_back(Consume().text());

  RemoveEscapes(texts, std::back_inserter(*out_data));
  return !texts.empty();
}